

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void ts_parser__log(TSParser *self)

{
  char *local_18;
  char *c;
  TSParser *self_local;
  
  if ((self->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) {
    (*(self->lexer).logger.log)
              ((self->lexer).logger.payload,TSLogTypeParse,(self->lexer).debug_buffer);
  }
  if (self->dot_graph_file != (FILE *)0x0) {
    fprintf((FILE *)self->dot_graph_file,"graph {\nlabel=\"");
    for (local_18 = (self->lexer).debug_buffer; *local_18 != '\0'; local_18 = local_18 + 1) {
      if (*local_18 == '\"') {
        fputc(0x5c,(FILE *)self->dot_graph_file);
      }
      fputc((int)*local_18,(FILE *)self->dot_graph_file);
    }
    fprintf((FILE *)self->dot_graph_file,"\"\n}\n\n");
  }
  return;
}

Assistant:

static void ts_parser__log(TSParser *self) {
  if (self->lexer.logger.log) {
    self->lexer.logger.log(
      self->lexer.logger.payload,
      TSLogTypeParse,
      self->lexer.debug_buffer
    );
  }

  if (self->dot_graph_file) {
    fprintf(self->dot_graph_file, "graph {\nlabel=\"");
    for (char *c = &self->lexer.debug_buffer[0]; *c != 0; c++) {
      if (*c == '"') fputc('\\', self->dot_graph_file);
      fputc(*c, self->dot_graph_file);
    }
    fprintf(self->dot_graph_file, "\"\n}\n\n");
  }
}